

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O2

int Au_NtkCheckRecursive(Au_Ntk_t *pNtk)

{
  Au_Man_t *pAVar1;
  Au_Ntk_t *p;
  Au_Obj_t *p_00;
  Au_Ntk_t *pAVar2;
  int i;
  int i_00;
  int local_3c;
  
  pAVar1 = pNtk->pMan;
  if (pAVar1 == (Au_Man_t *)0x0) {
    puts("There is no hierarchy information.");
    local_3c = 0;
  }
  else {
    local_3c = 0;
    for (i = 1; i < (pAVar1->vNtks).nSize; i = i + 1) {
      p = (Au_Ntk_t *)Vec_PtrEntry(&pAVar1->vNtks,i);
      for (i_00 = 0; i_00 < (p->vObjs).nSize; i_00 = i_00 + 1) {
        p_00 = Au_NtkObjI(p,i_00);
        if ((((undefined1  [16])*p_00 & (undefined1  [16])0x700000000) ==
             (undefined1  [16])0x600000000) && (pAVar2 = Au_ObjModel(p_00), pAVar2 == p)) {
          printf("WARNING: Model \"%s\" contains a recursive definition.\n",p->pName);
          local_3c = 1;
          break;
        }
      }
    }
  }
  return local_3c;
}

Assistant:

int Au_NtkCheckRecursive( Au_Ntk_t * pNtk )
{
    Vec_Ptr_t * vMods;
    Au_Ntk_t * pModel;
    Au_Obj_t * pObj;
    int i, k, RetValue = 0;

    if ( pNtk->pMan == NULL )
    {
        printf( "There is no hierarchy information.\n" );
        return RetValue;
    }

    vMods = &pNtk->pMan->vNtks;
    Vec_PtrForEachEntryStart( Au_Ntk_t *, vMods, pModel, i, 1 )
    {
        Au_NtkForEachObj( pModel, pObj, k )
            if ( Au_ObjIsBox(pObj) && Au_ObjModel(pObj) == pModel )
            {
                printf( "WARNING: Model \"%s\" contains a recursive definition.\n", Au_NtkName(pModel) );
                RetValue = 1;
                break;
            }
    }
    return RetValue;
}